

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  secp256k1_fe *r_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  secp256k1_modinv64_modinfo *psVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  secp256k1_gej *psVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  secp256k1_gej *psVar16;
  secp256k1_gej *psVar17;
  secp256k1_gej *psVar18;
  secp256k1_gej *psVar19;
  secp256k1_gej *psVar20;
  secp256k1_gej *a;
  ulong uVar21;
  long lVar22;
  uint64_t *puVar23;
  long lVar24;
  long lVar25;
  secp256k1_gej *psVar26;
  undefined1 *unaff_R13;
  secp256k1_gej *psVar27;
  ulong uVar28;
  secp256k1_gej *psVar29;
  secp256k1_gej *psVar30;
  undefined1 *puVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  secp256k1_fe zz;
  secp256k1_strauss_state sStack_c60;
  secp256k1_gej sStack_c48;
  secp256k1_fe asStack_bb0 [8];
  secp256k1_ge asStack_a30 [8];
  secp256k1_strauss_point_state sStack_6f0;
  secp256k1_gej *psStack_2e0;
  secp256k1_gej *psStack_2d8;
  code *pcStack_2d0;
  secp256k1_gej *psStack_2c0;
  secp256k1_gej *psStack_2b8;
  secp256k1_modinv64_modinfo *psStack_2b0;
  ulong uStack_2a8;
  secp256k1_gej *psStack_2a0;
  secp256k1_gej *psStack_298;
  ulong uStack_290;
  secp256k1_gej *psStack_288;
  secp256k1_gej *psStack_280;
  undefined1 auStack_278 [96];
  ulong uStack_218;
  secp256k1_gej *psStack_210;
  undefined1 auStack_208 [56];
  ulong uStack_1d0;
  ulong uStack_1c8;
  secp256k1_gej *psStack_1c0;
  undefined1 auStack_1b8 [96];
  secp256k1_gej *psStack_158;
  undefined1 *puStack_150;
  secp256k1_gej *psStack_148;
  undefined1 *puStack_140;
  code *pcStack_138;
  secp256k1_gej *psStack_130;
  secp256k1_gej *psStack_120;
  undefined1 auStack_110 [152];
  undefined8 uStack_78;
  secp256k1_fe local_50;
  
  psVar26 = (secp256k1_gej *)0x1000003d0;
  secp256k1_gej_verify(r);
  secp256k1_fe_verify(s);
  secp256k1_fe_verify(s);
  uVar7 = (s->n[4] >> 0x30) * 0x1000003d1 + s->n[0];
  if (((uVar7 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar7 & 0xfffffffffffff) != 0)) {
LAB_0014d581:
    secp256k1_fe_sqr(&local_50,s);
    secp256k1_fe_mul(&r->x,&r->x,&local_50);
    r_00 = &r->y;
    secp256k1_fe_mul(r_00,r_00,&local_50);
    secp256k1_fe_mul(r_00,r_00,s);
    secp256k1_fe_mul(&r->z,&r->z,s);
    secp256k1_gej_verify(r);
    return;
  }
  uVar12 = (uVar7 >> 0x34) + s->n[1];
  psVar16 = (secp256k1_gej *)((uVar12 >> 0x34) + s->n[2]);
  psVar19 = (secp256k1_gej *)(((ulong)psVar16 >> 0x34) + s->n[3]);
  uVar21 = ((ulong)psVar19 >> 0x34) + (s->n[4] & 0xffffffffffff);
  if ((((uVar12 | uVar7 | (ulong)psVar16 | (ulong)psVar19) & 0xfffffffffffff) != 0 || uVar21 != 0)
     && (((uVar7 | 0x1000003d0) & uVar12 & (ulong)psVar16 & (ulong)psVar19 &
         (uVar21 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014d581;
  secp256k1_gej_rescale_cold_1();
  uStack_78 = 0x1000003d0;
  psVar18 = (secp256k1_gej *)auStack_110;
  psVar20 = (secp256k1_gej *)auStack_110;
  puVar31 = auStack_110;
  auStack_110._144_8_ = r;
  secp256k1_gej_verify(psVar16);
  psVar19->infinity = psVar16->infinity;
  secp256k1_fe_mul(&psVar19->z,&psVar16->z,&psVar16->y);
  secp256k1_fe_sqr((secp256k1_fe *)auStack_110,&psVar16->y);
  psVar8 = (secp256k1_gej *)(auStack_110 + 0x60);
  psVar30 = psVar16;
  secp256k1_fe_sqr((secp256k1_fe *)psVar8,&psVar16->x);
  secp256k1_fe_verify((secp256k1_fe *)psVar8);
  if ((int)auStack_110._136_4_ < 0xb) {
    auStack_110._136_4_ = auStack_110._136_4_ * 3;
    psVar30 = (secp256k1_gej *)(auStack_110 + 0x60);
    auStack_110._96_8_ = auStack_110._96_8_ * 3;
    auStack_110._104_8_ = auStack_110._104_8_ * 3;
    auStack_110._112_8_ = auStack_110._112_8_ * 3;
    auStack_110._120_8_ = auStack_110._120_8_ * 3;
    auStack_110._128_8_ = auStack_110._128_8_ * 3;
    auStack_110._140_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar30);
    secp256k1_fe_half((secp256k1_fe *)psVar30);
    secp256k1_fe_verify((secp256k1_fe *)auStack_110);
    secp256k1_fe_verify_magnitude((secp256k1_fe *)auStack_110,1);
    auStack_110._48_8_ = 0x3ffffbfffff0bc - auStack_110._0_8_;
    auStack_110._56_8_ = 0x3ffffffffffffc - auStack_110._8_8_;
    psVar26 = (secp256k1_gej *)(auStack_110 + 0x30);
    auStack_110._64_8_ = 0x3ffffffffffffc - auStack_110._16_8_;
    auStack_110._72_8_ = 0x3ffffffffffffc - auStack_110._24_8_;
    auStack_110._80_8_ = 0x3fffffffffffc - auStack_110._32_8_;
    auStack_110._88_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)psVar26);
    secp256k1_fe_mul((secp256k1_fe *)psVar26,(secp256k1_fe *)psVar26,&psVar16->x);
    secp256k1_fe_sqr(&psVar19->x,(secp256k1_fe *)psVar30);
    secp256k1_fe_verify(&psVar19->x);
    psVar8 = psVar26;
    secp256k1_fe_verify((secp256k1_fe *)psVar26);
    iVar5 = auStack_110._88_4_ + (psVar19->x).magnitude;
    unaff_R13 = auStack_110;
    if (0x20 < iVar5) goto LAB_0014d94d;
    uVar1 = (psVar19->x).n[1];
    uVar2 = (psVar19->x).n[2];
    uVar3 = (psVar19->x).n[3];
    psVar16 = (secp256k1_gej *)(auStack_110 + 0x30);
    (psVar19->x).n[0] = (psVar19->x).n[0] + auStack_110._48_8_;
    (psVar19->x).n[1] = uVar1 + auStack_110._56_8_;
    (psVar19->x).n[2] = uVar2 + auStack_110._64_8_;
    (psVar19->x).n[3] = uVar3 + auStack_110._72_8_;
    puVar23 = (psVar19->x).n + 4;
    *puVar23 = *puVar23 + auStack_110._80_8_;
    (psVar19->x).magnitude = iVar5;
    (psVar19->x).normalized = 0;
    secp256k1_fe_verify(&psVar19->x);
    secp256k1_fe_verify(&psVar19->x);
    psVar8 = psVar16;
    secp256k1_fe_verify((secp256k1_fe *)psVar16);
    iVar5 = auStack_110._88_4_ + (psVar19->x).magnitude;
    unaff_R13 = auStack_110;
    if (0x20 < iVar5) goto LAB_0014d952;
    uVar1 = (psVar19->x).n[1];
    uVar2 = (psVar19->x).n[2];
    uVar3 = (psVar19->x).n[3];
    psVar16 = (secp256k1_gej *)(auStack_110 + 0x30);
    (psVar19->x).n[0] = (psVar19->x).n[0] + auStack_110._48_8_;
    (psVar19->x).n[1] = uVar1 + auStack_110._56_8_;
    (psVar19->x).n[2] = uVar2 + auStack_110._64_8_;
    (psVar19->x).n[3] = uVar3 + auStack_110._72_8_;
    puVar23 = (psVar19->x).n + 4;
    *puVar23 = *puVar23 + auStack_110._80_8_;
    (psVar19->x).magnitude = iVar5;
    (psVar19->x).normalized = 0;
    secp256k1_fe_verify(&psVar19->x);
    secp256k1_fe_sqr((secp256k1_fe *)auStack_110,(secp256k1_fe *)auStack_110);
    secp256k1_fe_verify((secp256k1_fe *)psVar16);
    psVar8 = psVar19;
    secp256k1_fe_verify(&psVar19->x);
    uVar6 = (psVar19->x).magnitude + auStack_110._88_4_;
    unaff_R13 = auStack_110;
    if (0x20 < (int)uVar6) goto LAB_0014d957;
    psVar18 = (secp256k1_gej *)(auStack_110 + 0x30);
    auStack_110._48_8_ = (psVar19->x).n[0] + auStack_110._48_8_;
    auStack_110._56_8_ = (psVar19->x).n[1] + auStack_110._56_8_;
    auStack_110._64_8_ = (psVar19->x).n[2] + auStack_110._64_8_;
    auStack_110._72_8_ = (psVar19->x).n[3] + auStack_110._72_8_;
    auStack_110._80_8_ = auStack_110._80_8_ + (psVar19->x).n[4];
    auStack_110._92_4_ = 0;
    auStack_110._88_4_ = uVar6;
    secp256k1_fe_verify((secp256k1_fe *)psVar18);
    psVar16 = (secp256k1_gej *)&psVar19->y;
    secp256k1_fe_mul((secp256k1_fe *)psVar16,(secp256k1_fe *)psVar18,
                     (secp256k1_fe *)(auStack_110 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)psVar16);
    secp256k1_fe_verify((secp256k1_fe *)auStack_110);
    iVar5 = auStack_110._40_4_ + (psVar19->y).magnitude;
    unaff_R13 = auStack_110;
    if (iVar5 < 0x21) {
      uVar1 = (psVar19->y).n[1];
      uVar2 = (psVar19->y).n[2];
      uVar3 = (psVar19->y).n[3];
      (psVar19->y).n[0] = (psVar19->y).n[0] + auStack_110._0_8_;
      (psVar19->y).n[1] = uVar1 + auStack_110._8_8_;
      (psVar19->y).n[2] = uVar2 + auStack_110._16_8_;
      (psVar19->y).n[3] = uVar3 + auStack_110._24_8_;
      puVar23 = (psVar19->y).n + 4;
      *puVar23 = *puVar23 + auStack_110._32_8_;
      (psVar19->y).magnitude = iVar5;
      (psVar19->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar16);
      secp256k1_fe_verify((secp256k1_fe *)psVar16);
      secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar16,2);
      uVar1 = (psVar19->y).n[1];
      uVar2 = (psVar19->y).n[2];
      uVar3 = (psVar19->y).n[3];
      (psVar19->y).n[0] = 0x5ffff9ffffe91a - (psVar19->y).n[0];
      (psVar19->y).n[1] = 0x5ffffffffffffa - uVar1;
      (psVar19->y).n[2] = 0x5ffffffffffffa - uVar2;
      (psVar19->y).n[3] = 0x5ffffffffffffa - uVar3;
      (psVar19->y).n[4] = 0x5fffffffffffa - (psVar19->y).n[4];
      (psVar19->y).magnitude = 3;
      (psVar19->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar16);
      secp256k1_gej_verify(psVar19);
      return;
    }
  }
  else {
    secp256k1_gej_double_cold_5();
LAB_0014d94d:
    secp256k1_gej_double_cold_4();
LAB_0014d952:
    psVar18 = psVar30;
    secp256k1_gej_double_cold_3();
LAB_0014d957:
    psVar20 = psVar8;
    puVar31 = auStack_110 + 0x60;
    secp256k1_gej_double_cold_2();
  }
  secp256k1_gej_double_cold_1();
  uVar7 = (ulong)psVar18 & 0xffffffff;
  psStack_130 = (secp256k1_gej *)0x14d96e;
  psVar8 = psVar20;
  psStack_120 = psVar19;
  secp256k1_fe_verify(&psVar20->x);
  if ((uint)psVar18 < 0x21) {
    iVar5 = (psVar20->x).magnitude * (uint)psVar18;
    if (iVar5 < 0x21) {
      (psVar20->x).n[0] = (psVar20->x).n[0] * uVar7;
      (psVar20->x).n[1] = (psVar20->x).n[1] * uVar7;
      (psVar20->x).n[2] = (psVar20->x).n[2] * uVar7;
      (psVar20->x).n[3] = (psVar20->x).n[3] * uVar7;
      (psVar20->x).n[4] = uVar7 * (psVar20->x).n[4];
      (psVar20->x).magnitude = iVar5;
      (psVar20->x).normalized = 0;
      secp256k1_fe_verify(&psVar20->x);
      return;
    }
  }
  else {
    psStack_130 = (secp256k1_gej *)0x14d9d4;
    secp256k1_fe_mul_int_unchecked_cold_2();
  }
  psStack_130 = (secp256k1_gej *)secp256k1_fe_half;
  secp256k1_fe_mul_int_unchecked_cold_1();
  pcStack_138 = (code *)0x14d9e2;
  psStack_130 = psVar20;
  secp256k1_fe_verify(&psVar8->x);
  pcStack_138 = (code *)0x14d9ef;
  psVar19 = psVar8;
  secp256k1_fe_verify_magnitude(&psVar8->x,0x1f);
  psStack_2b0 = (secp256k1_modinv64_modinfo *)(psVar8->x).n[0];
  uVar12 = -(ulong)((uint)psStack_2b0 & 1);
  uVar21 = uVar12 >> 0xc;
  uVar28 = (long)(psStack_2b0->modulus).v + (uVar21 & 0xffffefffffc2f);
  if ((uVar28 & 1) == 0) {
    uVar7 = (uVar12 >> 0x10) + (psVar8->x).n[4];
    uVar10 = uVar21 + (psVar8->x).n[3];
    uVar6 = (uint)(uVar12 >> 0x2c);
    auVar33._0_8_ = CONCAT44(uVar6,(int)uVar21);
    auVar33._8_4_ = (int)uVar21;
    auVar33._12_4_ = uVar6;
    uVar12 = auVar33._0_8_ + (psVar8->x).n[1];
    uVar21 = auVar33._8_8_ + (psVar8->x).n[2];
    (psVar8->x).n[0] = ((ulong)((uint)uVar12 & 1) << 0x33) + (uVar28 >> 1);
    (psVar8->x).n[1] = ((uVar21 & 1) << 0x33) + (uVar12 >> 1);
    (psVar8->x).n[2] = ((uVar10 & 1) << 0x33) + (uVar21 >> 1);
    (psVar8->x).n[3] = ((ulong)((uint)uVar7 & 1) << 0x33) + (uVar10 >> 1);
    (psVar8->x).n[4] = uVar7 >> 1;
    (psVar8->x).magnitude = ((psVar8->x).magnitude >> 1) + 1;
    (psVar8->x).normalized = 0;
    secp256k1_fe_verify(&psVar8->x);
    return;
  }
  pcStack_138 = secp256k1_modinv64;
  secp256k1_fe_half_cold_1();
  uVar12 = 0;
  auStack_1b8._16_8_ = 0;
  auStack_1b8._24_8_ = 0;
  auStack_1b8._0_8_ = 0;
  auStack_1b8._8_8_ = 0;
  auStack_1b8._32_8_ = 0;
  auStack_1b8._56_8_ = 0;
  auStack_1b8._80_8_ = 0;
  auStack_1b8._64_8_ = 0;
  auStack_1b8._72_8_ = 0;
  auStack_1b8._48_8_ = 1;
  auStack_278._32_8_ = (psStack_2b0->modulus).v[4];
  auStack_278._0_8_ = (psStack_2b0->modulus).v[0];
  psStack_288 = (secp256k1_gej *)(psStack_2b0->modulus).v[1];
  uStack_290 = (psStack_2b0->modulus).v[2];
  psStack_2b8 = (secp256k1_gej *)(psStack_2b0->modulus).v[3];
  auStack_208._0_8_ = (psVar19->x).n[0];
  psStack_298 = (secp256k1_gej *)(psVar19->x).n[1];
  psStack_2a0 = (secp256k1_gej *)(psVar19->x).n[2];
  psStack_280 = (secp256k1_gej *)(psVar19->x).n[3];
  psVar30 = (secp256k1_gej *)(psVar19->x).n[4];
  uVar21 = 0xffffffffffffffff;
  psVar18 = (secp256k1_gej *)auStack_278._0_8_;
  psVar20 = (secp256k1_gej *)auStack_208._0_8_;
  psVar27 = (secp256k1_gej *)auStack_278._32_8_;
  auStack_278._8_8_ = psStack_288;
  auStack_278._16_8_ = uStack_290;
  auStack_278._24_8_ = psStack_2b8;
  auStack_278._48_8_ = psVar19;
  auStack_208._8_8_ = psStack_298;
  auStack_208._16_8_ = psStack_2a0;
  auStack_208._24_8_ = psStack_280;
  auStack_208._32_8_ = psVar30;
  auStack_1b8._88_8_ = psVar8;
  psStack_158 = psVar26;
  puStack_150 = unaff_R13;
  psStack_148 = psVar16;
  puStack_140 = puVar31;
  pcStack_138 = (code *)uVar7;
  do {
    psVar4 = psStack_2b0;
    uVar28 = 8;
    lVar11 = 3;
    uVar7 = 0;
    uVar10 = 0;
    psVar17 = (secp256k1_gej *)0x8;
    psStack_2c0 = (secp256k1_gej *)0x8;
    psVar26 = psVar20;
    psVar16 = psVar18;
    psVar29 = psVar30;
    do {
      auStack_278._72_8_ = uVar12;
      auStack_278._80_8_ = psVar30;
      auStack_278._88_8_ = psVar27;
      if (((ulong)psVar16 & 1) == 0) {
        pcStack_2d0 = (code *)0x14e590;
        secp256k1_modinv64_cold_29();
        a = psVar19;
LAB_0014e590:
        pcStack_2d0 = (code *)0x14e595;
        secp256k1_modinv64_cold_1();
LAB_0014e595:
        pcStack_2d0 = (code *)0x14e59a;
        secp256k1_modinv64_cold_2();
LAB_0014e59a:
        pcStack_2d0 = (code *)0x14e59f;
        secp256k1_modinv64_cold_28();
        goto LAB_0014e59f;
      }
      a = (secp256k1_gej *)(uVar7 * (long)psVar20 + uVar28 * (long)psVar18);
      psVar17 = (secp256k1_gej *)((long)psVar16 << ((byte)lVar11 & 0x3f));
      if (a != psVar17) goto LAB_0014e590;
      a = (secp256k1_gej *)((long)psStack_2c0 * (long)psVar20 + uVar10 * (long)psVar18);
      psVar17 = (secp256k1_gej *)((long)psVar26 << ((byte)lVar11 & 0x3f));
      if (a != psVar17) goto LAB_0014e595;
      psVar17 = (secp256k1_gej *)((long)uVar21 >> 0x3f);
      uStack_218 = (ulong)((uint)psVar26 & 1);
      uVar9 = -uStack_218;
      psVar19 = (secp256k1_gej *)((ulong)psVar17 & uVar9);
      uVar21 = uVar21 ^ (ulong)psVar19;
      psVar8 = psVar18;
      a = psVar19;
      psVar29 = psVar20;
      psStack_210 = psVar17;
      if (uVar21 - 0x251 < 0xfffffffffffffb61) goto LAB_0014e59a;
      uVar21 = uVar21 - 1;
      a = (secp256k1_gej *)
          ((long)(psStack_2c0->x).n + (((ulong)psVar17 ^ uVar7) - (long)psVar17 & uVar9));
      uVar7 = (uVar7 + ((ulong)a & (ulong)psVar19)) * 2;
      uVar10 = uVar10 + (((ulong)psVar17 ^ uVar28) - (long)psVar17 & uVar9);
      uVar28 = (uVar28 + (uVar10 & (ulong)psVar19)) * 2;
      uVar9 = (long)(psVar26->x).n + (((ulong)psVar17 ^ (ulong)psVar16) - (long)psVar17 & uVar9);
      psVar26 = (secp256k1_gej *)(uVar9 >> 1);
      psVar16 = (secp256k1_gej *)((long)(psVar16->x).n + (uVar9 & (ulong)psVar19));
      lVar11 = lVar11 + 1;
      psStack_2c0 = a;
    } while (lVar11 != 0x3e);
    psVar17 = (secp256k1_gej *)(uVar7 * uVar10);
    auStack_208._48_8_ = uVar28;
    uStack_1d0 = uVar7;
    uStack_1c8 = uVar10;
    psStack_1c0 = a;
    if ((SUB168(SEXT816((long)uVar28) * SEXT816((long)a),8) -
        SUB168(SEXT816((long)uVar7) * SEXT816((long)uVar10),8)) -
        (ulong)((secp256k1_gej *)(uVar28 * (long)a) < psVar17) != 2 ||
        (long)(uVar28 * (long)a) - (long)psVar17 != 0) {
LAB_0014e59f:
      pcStack_2d0 = (code *)0x14e5a4;
      secp256k1_modinv64_cold_3();
LAB_0014e5a4:
      pcStack_2d0 = (code *)0x14e5a9;
      secp256k1_modinv64_cold_27();
LAB_0014e5a9:
      pcStack_2d0 = (code *)0x14e5ae;
      secp256k1_modinv64_cold_26();
LAB_0014e5ae:
      psVar26 = a;
      pcStack_2d0 = (code *)0x14e5b3;
      secp256k1_modinv64_cold_25();
LAB_0014e5b3:
      pcStack_2d0 = (code *)0x14e5b8;
      secp256k1_modinv64_cold_24();
LAB_0014e5b8:
      pcStack_2d0 = (code *)0x14e5bd;
      secp256k1_modinv64_cold_4();
LAB_0014e5bd:
      pcStack_2d0 = (code *)0x14e5c2;
      secp256k1_modinv64_cold_5();
LAB_0014e5c2:
      pcStack_2d0 = (code *)0x14e5c7;
      secp256k1_modinv64_cold_6();
LAB_0014e5c7:
      pcStack_2d0 = (code *)0x14e5cc;
      secp256k1_modinv64_cold_7();
LAB_0014e5cc:
      pcStack_2d0 = (code *)0x14e5d1;
      secp256k1_modinv64_cold_8();
LAB_0014e5d1:
      pcStack_2d0 = (code *)0x14e5d6;
      secp256k1_modinv64_cold_9();
LAB_0014e5d6:
      pcStack_2d0 = (code *)0x14e5db;
      secp256k1_modinv64_cold_10();
      psVar16 = psVar8;
LAB_0014e5db:
      pcStack_2d0 = (code *)0x14e5e0;
      secp256k1_modinv64_cold_11();
LAB_0014e5e0:
      pcStack_2d0 = (code *)0x14e5e5;
      secp256k1_modinv64_cold_12();
      psVar30 = psVar29;
LAB_0014e5e5:
      pcStack_2d0 = (code *)0x14e5ea;
      secp256k1_modinv64_cold_13();
LAB_0014e5ea:
      pcStack_2d0 = (code *)0x14e5ef;
      secp256k1_modinv64_cold_14();
LAB_0014e5ef:
      pcStack_2d0 = (code *)0x14e5f4;
      secp256k1_modinv64_cold_15();
LAB_0014e5f4:
      pcStack_2d0 = (code *)0x14e5f9;
      secp256k1_modinv64_cold_23();
      psVar18 = psVar17;
LAB_0014e5f9:
      pcStack_2d0 = (code *)0x14e5fe;
      secp256k1_modinv64_cold_22();
LAB_0014e5fe:
      psVar19 = psVar26;
      pcStack_2d0 = (code *)0x14e603;
      secp256k1_modinv64_cold_21();
      psVar8 = psVar16;
LAB_0014e603:
      pcStack_2d0 = (code *)0x14e608;
      secp256k1_modinv64_cold_20();
LAB_0014e608:
      pcStack_2d0 = (code *)0x14e60d;
      secp256k1_modinv64_cold_19();
LAB_0014e60d:
      pcStack_2d0 = (code *)0x14e612;
      secp256k1_modinv64_cold_18();
      goto LAB_0014e612;
    }
    pcStack_2d0 = (code *)0x14dd3b;
    uStack_2a8 = uVar10;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)auStack_1b8,
               (secp256k1_modinv64_signed62 *)(auStack_1b8 + 0x30),
               (secp256k1_modinv64_trans2x2 *)(auStack_208 + 0x30),psStack_2b0);
    a = (secp256k1_gej *)auStack_278;
    psVar17 = (secp256k1_gej *)0x5;
    pcStack_2d0 = (code *)0x14dd54;
    iVar5 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a,5,&psVar4->modulus,-1);
    if (iVar5 < 1) goto LAB_0014e5a4;
    a = (secp256k1_gej *)auStack_278;
    psVar17 = (secp256k1_gej *)0x5;
    pcStack_2d0 = (code *)0x14dd75;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a,5,&psStack_2b0->modulus,1);
    if (0 < iVar5) goto LAB_0014e5a9;
    psVar26 = (secp256k1_gej *)auStack_208;
    psVar17 = (secp256k1_gej *)0x5;
    pcStack_2d0 = (code *)0x14dd9e;
    a = psVar26;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar26,5,&psStack_2b0->modulus,-1);
    if (iVar5 < 1) goto LAB_0014e5ae;
    psVar17 = (secp256k1_gej *)0x5;
    pcStack_2d0 = (code *)0x14ddbd;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar26,5,&psStack_2b0->modulus,1);
    psVar4 = psStack_2b0;
    if (-1 < iVar5) goto LAB_0014e5b3;
    psVar26 = (secp256k1_gej *)(uVar28 * (long)psVar18);
    psVar17 = SUB168(SEXT816((long)uVar28) * SEXT816((long)psVar18),8);
    uVar12 = uVar7 * (long)psVar20;
    lVar11 = SUB168(SEXT816((long)uVar7) * SEXT816((long)psVar20),8);
    if ((-1 < lVar11) &&
       (uVar10 = (ulong)((secp256k1_gej *)(-1 - uVar12) < psVar26),
       lVar13 = (0x7fffffffffffffff - lVar11) - (long)psVar17,
       (SBORROW8(0x7fffffffffffffff - lVar11,(long)psVar17) != SBORROW8(lVar13,uVar10)) !=
       (long)(lVar13 - uVar10) < 0)) goto LAB_0014e5b8;
    puVar23 = (uint64_t *)((long)(psVar26->x).n + uVar12);
    lVar11 = (long)(psVar17->x).n + (ulong)CARRY8(uVar12,(ulong)psVar26) + lVar11;
    psVar26 = (secp256k1_gej *)(uStack_2a8 * (long)psVar18);
    psVar17 = SUB168(SEXT816((long)uStack_2a8) * SEXT816((long)psVar18),8);
    uVar12 = (long)psStack_2c0 * (long)psVar20;
    lVar13 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)psVar20),8);
    if ((-1 < lVar13) &&
       (uVar10 = (ulong)((secp256k1_gej *)(-1 - uVar12) < psVar26),
       lVar14 = (0x7fffffffffffffff - lVar13) - (long)psVar17,
       (SBORROW8(0x7fffffffffffffff - lVar13,(long)psVar17) != SBORROW8(lVar14,uVar10)) !=
       (long)(lVar14 - uVar10) < 0)) goto LAB_0014e5bd;
    bVar32 = CARRY8((ulong)psVar26,uVar12);
    psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + uVar12);
    psVar17 = (secp256k1_gej *)((long)(psVar17->x).n + (ulong)bVar32 + lVar13);
    if (((ulong)puVar23 & 0x3ffffffffffffffe) != 0) goto LAB_0014e5c2;
    if (((ulong)psVar26 & 0x3fffffffffffffff) != 0) goto LAB_0014e5c7;
    uVar12 = (ulong)puVar23 >> 0x3e | lVar11 * 4;
    uVar10 = (long)psStack_288 * uVar28 + uVar12;
    lVar22 = SUB168(SEXT816((long)psStack_288) * SEXT816((long)uVar28),8) + (lVar11 >> 0x3e) +
             (ulong)CARRY8((long)psStack_288 * uVar28,uVar12);
    psVar8 = (secp256k1_gej *)((long)psStack_298 * uVar7);
    lVar14 = SUB168(SEXT816((long)psStack_298) * SEXT816((long)uVar7),8);
    uVar12 = (ulong)(-(long)psVar8 - 1U < uVar10);
    lVar11 = (0x7fffffffffffffff - lVar14) - lVar22;
    lVar24 = (-0x8000000000000000 - lVar14) - (ulong)(psVar8 != (secp256k1_gej *)0x0);
    lVar13 = lVar22 - lVar24;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar22) != SBORROW8(lVar11,uVar12)) ==
             (long)(lVar11 - uVar12) < 0;
    if (lVar14 < 0) {
      bVar32 = (SBORROW8(lVar22,lVar24) != SBORROW8(lVar13,(ulong)(uVar10 < (ulong)-(long)psVar8)))
               == (long)(lVar13 - (ulong)(uVar10 < (ulong)-(long)psVar8)) < 0;
    }
    psVar29 = psStack_298;
    if (!bVar32) goto LAB_0014e5cc;
    uVar12 = (ulong)psVar26 >> 0x3e | (long)psVar17 * 4;
    uVar15 = (long)psStack_288 * uStack_2a8 + uVar12;
    lVar13 = SUB168(SEXT816((long)psStack_288) * SEXT816((long)uStack_2a8),8) +
             ((long)psVar17 >> 0x3e) + (ulong)CARRY8((long)psStack_288 * uStack_2a8,uVar12);
    uVar9 = (long)psStack_298 * (long)psStack_2c0;
    psVar26 = SUB168(SEXT816((long)psStack_298) * SEXT816((long)psStack_2c0),8);
    uVar12 = (ulong)(-uVar9 - 1 < uVar15);
    lVar11 = (0x7fffffffffffffff - (long)psVar26) - lVar13;
    psVar17 = (secp256k1_gej *)((-0x8000000000000000 - (long)psVar26) - (ulong)(uVar9 != 0));
    bVar32 = (SBORROW8(0x7fffffffffffffff - (long)psVar26,lVar13) != SBORROW8(lVar11,uVar12)) ==
             (long)(lVar11 - uVar12) < 0;
    if ((long)psVar26 < 0) {
      bVar32 = (SBORROW8(lVar13,(long)psVar17) !=
               SBORROW8(lVar13 - (long)psVar17,(ulong)(uVar15 < -uVar9))) ==
               (long)((lVar13 - (long)psVar17) - (ulong)(uVar15 < -uVar9)) < 0;
    }
    if (!bVar32) goto LAB_0014e5d1;
    uVar12 = (long)(psVar8->x).n + uVar10;
    lVar11 = lVar14 + lVar22 + (ulong)CARRY8((ulong)psVar8,uVar10);
    psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (ulong)CARRY8(uVar9,uVar15) + lVar13);
    uVar10 = lVar11 * 4 | uVar12 >> 0x3e;
    auStack_278._0_8_ = uVar12 & 0x3fffffffffffffff;
    psVar8 = (secp256k1_gej *)(uVar9 + uVar15 & 0x3fffffffffffffff);
    psStack_288 = (secp256k1_gej *)(uStack_290 * uVar28 + uVar10);
    lVar13 = (lVar11 >> 0x3e) + SUB168(SEXT816((long)uStack_290) * SEXT816((long)uVar28),8) +
             (ulong)CARRY8(uStack_290 * uVar28,uVar10);
    psStack_298 = (secp256k1_gej *)((long)psStack_2a0 * uVar7);
    lVar14 = SUB168(SEXT816((long)psStack_2a0) * SEXT816((long)uVar7),8);
    uVar12 = (ulong)((secp256k1_gej *)(-1 - (long)psStack_298) < psStack_288);
    lVar11 = (0x7fffffffffffffff - lVar14) - lVar13;
    psVar17 = (secp256k1_gej *)
              ((-0x8000000000000000 - lVar14) - (ulong)(psStack_298 != (secp256k1_gej *)0x0));
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar13) != SBORROW8(lVar11,uVar12)) ==
             (long)(lVar11 - uVar12) < 0;
    if (lVar14 < 0) {
      bVar32 = (SBORROW8(lVar13,(long)psVar17) !=
               SBORROW8(lVar13 - (long)psVar17,
                        (ulong)(psStack_288 < (secp256k1_gej *)-(long)psStack_298))) ==
               (long)((lVar13 - (long)psVar17) -
                     (ulong)(psStack_288 < (secp256k1_gej *)-(long)psStack_298)) < 0;
    }
    psVar29 = psStack_2a0;
    auStack_278._64_8_ = psVar8;
    auStack_208._0_8_ = psVar8;
    if (!bVar32) goto LAB_0014e5d6;
    uVar12 = uVar9 + uVar15 >> 0x3e | (long)psVar26 * 4;
    uVar9 = uStack_290 * uStack_2a8 + uVar12;
    psVar17 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_290) * SEXT816((long)uStack_2a8),8) +
               ((long)psVar26 >> 0x3e) + (ulong)CARRY8(uStack_290 * uStack_2a8,uVar12));
    uVar10 = (long)psStack_2a0 * (long)psStack_2c0;
    lVar24 = SUB168(SEXT816((long)psStack_2a0) * SEXT816((long)psStack_2c0),8);
    uVar12 = (ulong)(-uVar10 - 1 < uVar9);
    lVar11 = (0x7fffffffffffffff - lVar24) - (long)psVar17;
    lVar25 = (-0x8000000000000000 - lVar24) - (ulong)(uVar10 != 0);
    lVar22 = (long)psVar17 - lVar25;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar24,(long)psVar17) != SBORROW8(lVar11,uVar12)) ==
             (long)(lVar11 - uVar12) < 0;
    if (lVar24 < 0) {
      bVar32 = (SBORROW8((long)psVar17,lVar25) != SBORROW8(lVar22,(ulong)(uVar9 < -uVar10))) ==
               (long)(lVar22 - (ulong)(uVar9 < -uVar10)) < 0;
    }
    psVar26 = (secp256k1_gej *)(ulong)bVar32;
    psVar16 = psVar8;
    auStack_278._56_8_ = auStack_278._0_8_;
    if (bVar32 == false) goto LAB_0014e5db;
    uVar15 = (long)(psStack_288->x).n + (long)(psStack_298->x).n;
    lVar11 = lVar13 + lVar14 + (ulong)CARRY8((ulong)psStack_288,(ulong)psStack_298);
    psVar17 = (secp256k1_gej *)((long)(psVar17->x).n + (ulong)CARRY8(uVar9,uVar10) + lVar24);
    uVar12 = lVar11 * 4 | uVar15 >> 0x3e;
    psVar29 = (secp256k1_gej *)(uVar15 & 0x3fffffffffffffff);
    psStack_298 = (secp256k1_gej *)(uVar9 + uVar10 & 0x3fffffffffffffff);
    uVar15 = (long)psStack_2b8 * uVar28 + uVar12;
    lVar13 = (lVar11 >> 0x3e) + SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)uVar28),8) +
             (ulong)CARRY8((long)psStack_2b8 * uVar28,uVar12);
    psStack_2a0 = (secp256k1_gej *)((long)psStack_280 * uVar7);
    lVar14 = SUB168(SEXT816((long)psStack_280) * SEXT816((long)uVar7),8);
    uVar12 = (ulong)(-(long)psStack_2a0 - 1U < uVar15);
    lVar11 = (0x7fffffffffffffff - lVar14) - lVar13;
    psVar26 = (secp256k1_gej *)
              ((-0x8000000000000000 - lVar14) - (ulong)(psStack_2a0 != (secp256k1_gej *)0x0));
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar13) != SBORROW8(lVar11,uVar12)) ==
             (long)(lVar11 - uVar12) < 0;
    if (lVar14 < 0) {
      bVar32 = (SBORROW8(lVar13,(long)psVar26) !=
               SBORROW8(lVar13 - (long)psVar26,(ulong)(uVar15 < (ulong)-(long)psStack_2a0))) ==
               (long)((lVar13 - (long)psVar26) - (ulong)(uVar15 < (ulong)-(long)psStack_2a0)) < 0;
    }
    psVar16 = psStack_280;
    auStack_278._8_8_ = psVar29;
    auStack_208._8_8_ = psStack_298;
    if (!bVar32) goto LAB_0014e5e0;
    uVar12 = uVar9 + uVar10 >> 0x3e | (long)psVar17 * 4;
    uVar9 = (long)psStack_2b8 * uStack_2a8 + uVar12;
    psVar26 = (secp256k1_gej *)
              (SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)uStack_2a8),8) +
               ((long)psVar17 >> 0x3e) + (ulong)CARRY8((long)psStack_2b8 * uStack_2a8,uVar12));
    uVar10 = (long)psStack_280 * (long)psStack_2c0;
    lVar24 = SUB168(SEXT816((long)psStack_280) * SEXT816((long)psStack_2c0),8);
    uVar12 = (ulong)(-uVar10 - 1 < uVar9);
    lVar11 = (0x7fffffffffffffff - lVar24) - (long)psVar26;
    lVar25 = (-0x8000000000000000 - lVar24) - (ulong)(uVar10 != 0);
    lVar22 = (long)psVar26 - lVar25;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar24,(long)psVar26) != SBORROW8(lVar11,uVar12)) ==
             (long)(lVar11 - uVar12) < 0;
    if (lVar24 < 0) {
      bVar32 = (SBORROW8((long)psVar26,lVar25) != SBORROW8(lVar22,(ulong)(uVar9 < -uVar10))) ==
               (long)(lVar22 - (ulong)(uVar9 < -uVar10)) < 0;
    }
    psVar17 = (secp256k1_gej *)(ulong)bVar32;
    psVar30 = psVar29;
    uStack_290 = uVar15;
    if (bVar32 == false) goto LAB_0014e5e5;
    uStack_290 = (long)(psStack_2a0->x).n + uVar15;
    lVar11 = lVar13 + lVar14 + (ulong)CARRY8(uVar15,(ulong)psStack_2a0);
    psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (ulong)CARRY8(uVar9,uVar10) + lVar24);
    uVar12 = lVar11 * 4 | uStack_290 >> 0x3e;
    uStack_290 = uStack_290 & 0x3fffffffffffffff;
    psStack_2a0 = (secp256k1_gej *)(uVar9 + uVar10 & 0x3fffffffffffffff);
    psStack_2b8 = (secp256k1_gej *)(auStack_278._88_8_ * uVar28 + uVar12);
    lVar14 = (lVar11 >> 0x3e) + SUB168(SEXT816((long)auStack_278._88_8_) * SEXT816((long)uVar28),8)
             + (ulong)CARRY8(auStack_278._88_8_ * uVar28,uVar12);
    uVar12 = auStack_278._80_8_ * uVar7;
    psVar17 = SUB168(SEXT816((long)auStack_278._80_8_) * SEXT816((long)uVar7),8);
    uVar7 = (ulong)((secp256k1_gej *)(-1 - uVar12) < psStack_2b8);
    lVar11 = (0x7fffffffffffffff - (long)psVar17) - lVar14;
    lVar22 = (-0x8000000000000000 - (long)psVar17) - (ulong)(uVar12 != 0);
    lVar13 = lVar14 - lVar22;
    bVar32 = (SBORROW8(0x7fffffffffffffff - (long)psVar17,lVar14) != SBORROW8(lVar11,uVar7)) ==
             (long)(lVar11 - uVar7) < 0;
    if ((long)psVar17 < 0) {
      bVar32 = (SBORROW8(lVar14,lVar22) !=
               SBORROW8(lVar13,(ulong)(psStack_2b8 < (secp256k1_gej *)-uVar12))) ==
               (long)(lVar13 - (ulong)(psStack_2b8 < (secp256k1_gej *)-uVar12)) < 0;
    }
    psVar16 = (secp256k1_gej *)auStack_278._80_8_;
    psVar30 = psStack_2a0;
    psStack_288 = psVar29;
    auStack_278._16_8_ = uStack_290;
    auStack_208._16_8_ = psStack_2a0;
    if (!bVar32) goto LAB_0014e5ea;
    uVar7 = uVar9 + uVar10 >> 0x3e | (long)psVar26 * 4;
    psVar30 = (secp256k1_gej *)(auStack_278._88_8_ * uStack_2a8 + uVar7);
    lVar24 = SUB168(SEXT816((long)auStack_278._88_8_) * SEXT816((long)uStack_2a8),8) +
             ((long)psVar26 >> 0x3e) + (ulong)CARRY8(auStack_278._88_8_ * uStack_2a8,uVar7);
    uVar28 = auStack_278._80_8_ * (long)psStack_2c0;
    lVar22 = SUB168(SEXT816((long)auStack_278._80_8_) * SEXT816((long)psStack_2c0),8);
    uVar7 = (ulong)((secp256k1_gej *)(-1 - uVar28) < psVar30);
    lVar11 = (0x7fffffffffffffff - lVar22) - lVar24;
    lVar25 = (-0x8000000000000000 - lVar22) - (ulong)(uVar28 != 0);
    lVar13 = lVar24 - lVar25;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar22,lVar24) != SBORROW8(lVar11,uVar7)) ==
             (long)(lVar11 - uVar7) < 0;
    if (lVar22 < 0) {
      bVar32 = (SBORROW8(lVar24,lVar25) !=
               SBORROW8(lVar13,(ulong)(psVar30 < (secp256k1_gej *)-uVar28))) ==
               (long)(lVar13 - (ulong)(psVar30 < (secp256k1_gej *)-uVar28)) < 0;
    }
    psVar26 = (secp256k1_gej *)(ulong)bVar32;
    if (bVar32 == false) goto LAB_0014e5ef;
    puVar23 = (uint64_t *)((long)(psStack_2b8->x).n + uVar12);
    lVar11 = (long)(psVar17->x).n + (ulong)CARRY8((ulong)psStack_2b8,uVar12) + lVar14;
    bVar32 = CARRY8((ulong)psVar30,uVar28);
    psVar30 = (secp256k1_gej *)((long)(psVar30->x).n + uVar28);
    lVar13 = lVar24 + lVar22 + (ulong)bVar32;
    psVar17 = (secp256k1_gej *)(lVar11 * 4 | (ulong)puVar23 >> 0x3e);
    psVar26 = (secp256k1_gej *)((ulong)puVar23 & 0x3fffffffffffffff);
    psVar16 = (secp256k1_gej *)((ulong)psVar30 & 0x3fffffffffffffff);
    auStack_278._24_8_ = psVar26;
    auStack_208._24_8_ = psVar16;
    if ((lVar11 >> 0x3e) + -1 + (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar17) != -1)
    goto LAB_0014e5f4;
    psVar30 = (secp256k1_gej *)((ulong)psVar30 >> 0x3e | lVar13 * 4);
    psVar18 = psVar17;
    auStack_278._32_8_ = psVar17;
    if ((lVar13 >> 0x3e) + -1 + (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar30) != -1)
    goto LAB_0014e5f9;
    psVar19 = (secp256k1_gej *)auStack_278;
    psVar18 = (secp256k1_gej *)0x5;
    pcStack_2d0 = (code *)0x14e3eb;
    psVar8 = psVar19;
    psStack_2b8 = psVar26;
    auStack_208._32_8_ = psVar30;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar19,5,&psStack_2b0->modulus,-1);
    psVar26 = psVar8;
    if (iVar5 < 1) goto LAB_0014e5fe;
    psVar18 = (secp256k1_gej *)0x5;
    pcStack_2d0 = (code *)0x14e408;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar19,5,&psVar4->modulus,1);
    psVar8 = psVar16;
    if (0 < iVar5) goto LAB_0014e603;
    psVar8 = (secp256k1_gej *)auStack_208;
    psVar18 = (secp256k1_gej *)0x5;
    pcStack_2d0 = (code *)0x14e434;
    psVar19 = psVar8;
    psStack_280 = psVar16;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar8,5,&psVar4->modulus,-1);
    if (iVar5 < 1) goto LAB_0014e608;
    psVar18 = (secp256k1_gej *)0x5;
    pcStack_2d0 = (code *)0x14e451;
    psVar19 = psVar8;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar8,5,&psVar4->modulus,1);
    if (-1 < iVar5) goto LAB_0014e60d;
    uVar6 = (int)auStack_278._72_8_ + 1;
    uVar12 = (ulong)uVar6;
    psVar18 = (secp256k1_gej *)auStack_278._56_8_;
    psVar20 = (secp256k1_gej *)auStack_278._64_8_;
    psVar27 = psVar17;
  } while (uVar6 != 10);
  psVar19 = (secp256k1_gej *)auStack_208;
  psVar18 = (secp256k1_gej *)0x5;
  pcStack_2d0 = (code *)0x14e499;
  iVar5 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar19,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar5 == 0) {
    pcStack_2d0 = (code *)0x14e4be;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_278,5,&SECP256K1_SIGNED62_ONE,-1);
    psVar30 = (secp256k1_gej *)auStack_278._48_8_;
    if (iVar5 != 0) {
      pcStack_2d0 = (code *)0x14e4e5;
      iVar5 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)auStack_278,5,&SECP256K1_SIGNED62_ONE,1);
      if (iVar5 != 0) {
        psVar18 = (secp256k1_gej *)0x5;
        pcStack_2d0 = (code *)0x14e4ff;
        psVar19 = psVar30;
        iVar5 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar30,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar5 == 0) {
          psVar19 = (secp256k1_gej *)auStack_1b8;
          psVar18 = (secp256k1_gej *)0x5;
          pcStack_2d0 = (code *)0x14e522;
          iVar5 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar19,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar5 == 0) {
            psVar19 = (secp256k1_gej *)auStack_278;
            psVar18 = (secp256k1_gej *)0x5;
            pcStack_2d0 = (code *)0x14e541;
            iVar5 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar19,5,&psVar4->modulus,1);
            if (iVar5 == 0) goto LAB_0014e549;
          }
        }
        goto LAB_0014e617;
      }
    }
LAB_0014e549:
    pcStack_2d0 = (code *)0x14e561;
    secp256k1_modinv64_normalize_62
              ((secp256k1_modinv64_signed62 *)auStack_1b8,auStack_278._32_8_,psVar4);
    (psVar30->x).n[4] = auStack_1b8._32_8_;
    (psVar30->x).n[2] = auStack_1b8._16_8_;
    (psVar30->x).n[3] = auStack_1b8._24_8_;
    (psVar30->x).n[0] = auStack_1b8._0_8_;
    (psVar30->x).n[1] = auStack_1b8._8_8_;
    return;
  }
LAB_0014e612:
  pcStack_2d0 = (code *)0x14e617;
  secp256k1_modinv64_cold_16();
LAB_0014e617:
  pcStack_2d0 = secp256k1_eckey_pubkey_tweak_add;
  secp256k1_modinv64_cold_17();
  psStack_2e0 = psVar8;
  psStack_2d8 = psVar30;
  pcStack_2d0 = (code *)uVar21;
  secp256k1_gej_set_ge(&sStack_c48,(secp256k1_ge *)psVar19);
  sStack_c60.aux = asStack_bb0;
  sStack_c60.pre_a = asStack_a30;
  sStack_c60.ps = &sStack_6f0;
  secp256k1_ecmult_strauss_wnaf
            (&sStack_c60,&sStack_c48,1,&sStack_c48,&secp256k1_scalar_one,(secp256k1_scalar *)psVar18
            );
  secp256k1_gej_verify(&sStack_c48);
  if (sStack_c48.infinity == 0) {
    secp256k1_ge_set_gej((secp256k1_ge *)psVar19,&sStack_c48);
  }
  return;
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_FE_VERIFY(s);
    VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(s));

    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */

    SECP256K1_GEJ_VERIFY(r);
}